

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsprite.c
# Opt level: O0

int LoadSprite(char *file)

{
  FILE *pFVar1;
  undefined8 uVar2;
  SDL_Surface *pSVar3;
  SDL_Surface *temp;
  char *file_local;
  
  uVar2 = SDL_RWFromFile(file,"rb");
  sprite = (SDL_Surface *)SDL_LoadBMP_RW(uVar2,1);
  pFVar1 = _stderr;
  if (sprite == (SDL_Surface *)0x0) {
    uVar2 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t load %s: %s",file,uVar2);
    file_local._4_4_ = -1;
  }
  else {
    if (sprite->format->palette != (SDL_Palette *)0x0) {
      SDL_SetColorKey(sprite,0x5000,*sprite->pixels);
    }
    pSVar3 = (SDL_Surface *)SDL_DisplayFormat(sprite);
    SDL_FreeSurface(sprite);
    pFVar1 = _stderr;
    if (pSVar3 == (SDL_Surface *)0x0) {
      uVar2 = SDL_GetError();
      fprintf(pFVar1,"Couldn\'t convert background: %s\n",uVar2);
      file_local._4_4_ = -1;
    }
    else {
      file_local._4_4_ = 0;
      sprite = pSVar3;
    }
  }
  return file_local._4_4_;
}

Assistant:

int LoadSprite(const char *file)
{
	SDL_Surface *temp;

	/* Load the sprite image */
	sprite = SDL_LoadBMP(file);
	if ( sprite == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s", file, SDL_GetError());
		return(-1);
	}

	/* Set transparent pixel as the pixel at (0,0) */
	if ( sprite->format->palette ) {
		SDL_SetColorKey(sprite, (SDL_SRCCOLORKEY|SDL_RLEACCEL),
						*(Uint8 *)sprite->pixels);
	}

	/* Convert sprite to video format */
	temp = SDL_DisplayFormat(sprite);
	SDL_FreeSurface(sprite);
	if ( temp == NULL ) {
		fprintf(stderr, "Couldn't convert background: %s\n",
							SDL_GetError());
		return(-1);
	}
	sprite = temp;

	/* We're ready to roll. :) */
	return(0);
}